

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O0

void __thiscall test::test_generate_and_sign::test_method(test_generate_and_sign *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  pointer pCVar3;
  lazy_ostream *plVar4;
  long lVar5;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]> local_150;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [8];
  string signature;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]> local_a0;
  assertion_result local_80;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58;
  undefined1 local_48 [8];
  string privateK;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> local_18;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  test_generate_and_sign *this_local;
  
  crypto._M_t.
  super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t.
  super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
  super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl =
       (__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
        )(__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
          )this;
  license::CryptoHelper::getInstance();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  (**pCVar3->_vptr_CryptoHelper)();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  (*pCVar3->_vptr_CryptoHelper[1])(local_48);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_58,0x31,&local_68);
    bVar2 = boost::algorithm::starts_with<std::__cxx11::string,char[32]>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,(char (*) [32])"-----BEGIN RSA PRIVATE KEY-----");
    boost::test_tools::assertion_result::assertion_result(&local_80,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_a0,plVar4,(char (*) [40])"Private key is in openssl pkcs#1 format");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&signature.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion
              (&local_80,&local_a0,(undefined1 *)((long)&signature.field_2 + 8),0x31,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]>::
    ~lazy_ostream_impl(&local_a0);
    boost::test_tools::assertion_result::~assertion_result(&local_80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"testString",&local_f1);
  (*pCVar3->_vptr_CryptoHelper[5])(local_d0,pCVar3,local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_108,0x33,&local_118);
    lVar5 = std::__cxx11::string::size();
    boost::test_tools::assertion_result::assertion_result(&local_130,lVar5 == 0xac);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_150,plVar4,(char (*) [28])"signature is the right size");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_150,&local_160,0x33,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>::
    ~lazy_ostream_impl(&local_150);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::release
            (&local_18);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)local_48);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string privateK = crypto->exportPrivateKey();
	BOOST_CHECK_MESSAGE(boost::starts_with(privateK, "-----BEGIN RSA PRIVATE KEY-----"),
						"Private key is in openssl pkcs#1 format");
	const std::string signature = crypto->signString("testString");
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
	/*
	 ofstream myfile("private_key-linux.rsa");
	 myfile << privateK;
	 myfile.close();*/
}